

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.cpp
# Opt level: O0

void __thiscall SGParser::Generator::NFA::MoveData(NFA *this,NFA *source)

{
  NFA *source_local;
  NFA *this_local;
  
  Destroy(this);
  this->pStartState = source->pStartState;
  std::vector<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>::
  operator=(&this->FinalState,&source->FinalState);
  source->pStartState = (NFANode *)0x0;
  std::vector<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>::
  clear(&source->FinalState);
  return;
}

Assistant:

void NFA::MoveData(NFA& source) {
    // Destroy this NFA's data if it exists
    Destroy();

    // Move data
    pStartState = source.pStartState;
    FinalState  = source.FinalState;

    // And empty out source
    source.pStartState = nullptr;
    source.FinalState.clear();
}